

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

int __thiscall
QCommonListViewBase::horizontalScrollToValue
          (QCommonListViewBase *this,int param_1,ScrollHint hint,bool leftOf,bool rightOf,
          QRect *area,QRect *rect)

{
  int iVar1;
  int iVar2;
  LayoutDirection LVar3;
  QScrollBar *this_00;
  int iVar4;
  
  this_00 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->qq);
  iVar2 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
  LVar3 = QWidget::layoutDirection((QWidget *)this->qq);
  if (LVar3 != RightToLeft) {
    if (hint == PositionAtCenter) {
      iVar1 = (rect->x1).m_i;
      return (iVar2 + iVar1) - ((((area->x2).m_i + iVar1) - (area->x1).m_i) - (rect->x2).m_i) / 2;
    }
    if (leftOf) {
      return iVar2 + (rect->x1).m_i;
    }
    if (!rightOf) {
      return iVar2;
    }
    iVar1 = (rect->x1).m_i;
    iVar4 = ~(area->x2).m_i + (rect->x2).m_i + (area->x1).m_i;
    if (iVar1 < iVar4) {
      iVar4 = iVar1;
    }
    return iVar2 + iVar4;
  }
  if (hint == PositionAtCenter) {
    iVar1 = (rect->x1).m_i;
    iVar2 = iVar2 - iVar1;
    iVar4 = ((((area->x2).m_i - (area->x1).m_i) - (rect->x2).m_i) + iVar1) / 2;
  }
  else {
    if (leftOf) {
      return iVar2 - (rect->x1).m_i;
    }
    if (!rightOf) {
      return iVar2;
    }
    iVar1 = (rect->x1).m_i;
    iVar4 = ((area->x2).m_i - ((area->x1).m_i + (rect->x2).m_i)) + 1;
    if (iVar1 < iVar4) {
      iVar4 = iVar1;
    }
  }
  return iVar2 + iVar4;
}

Assistant:

int QCommonListViewBase::horizontalScrollToValue(const int /*index*/, QListView::ScrollHint hint,
                                            bool leftOf, bool rightOf, const QRect &area, const QRect &rect) const
{
    int horizontalValue = horizontalScrollBar()->value();
    if (isRightToLeft()) {
        if (hint == QListView::PositionAtCenter) {
            horizontalValue += ((area.width() - rect.width()) / 2) - rect.left();
        } else {
            if (leftOf)
                horizontalValue -= rect.left();
            else if (rightOf)
                horizontalValue += qMin(rect.left(), area.width() - rect.right());
        }
    } else {
        if (hint == QListView::PositionAtCenter) {
            horizontalValue += rect.left() - ((area.width()- rect.width()) / 2);
        } else {
            if (leftOf)
                horizontalValue += rect.left();
            else if (rightOf)
                horizontalValue += qMin(rect.left(), rect.right() - area.width());
        }
    }
    return horizontalValue;
}